

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_long>
          (XmlWriter *this,string *name,unsigned_long *attribute)

{
  XmlWriter *pXVar1;
  ulong *in_RDX;
  ostringstream oss;
  string local_1c0 [48];
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  XmlWriter *in_stack_fffffffffffffe80;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe70);
  std::ostream::operator<<((ostringstream *)&stack0xfffffffffffffe70,*in_RDX);
  std::__cxx11::ostringstream::str();
  pXVar1 = writeAttribute(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe70);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }